

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pred_common.c
# Opt level: O3

int av1_get_pred_context_uni_comp_ref_p(MACROBLOCKD *xd)

{
  undefined4 uVar1;
  int iVar2;
  ushort uVar3;
  ushort uVar4;
  
  uVar1 = *(undefined4 *)(xd->neighbors_ref_counts + 1);
  uVar4 = (ushort)(byte)((uint)uVar1 >> 0x18) + (ushort)(byte)((uint)uVar1 >> 8) +
          (ushort)(byte)((uint)uVar1 >> 0x10) + (ushort)(byte)uVar1;
  uVar3 = (ushort)xd->neighbors_ref_counts[7] +
          (ushort)xd->neighbors_ref_counts[6] + (ushort)xd->neighbors_ref_counts[5];
  iVar2 = 1;
  if (uVar3 != uVar4) {
    iVar2 = (uint)(uVar3 <= uVar4) * 2;
  }
  return iVar2;
}

Assistant:

int av1_get_pred_context_uni_comp_ref_p(const MACROBLOCKD *xd) {
  const uint8_t *const ref_counts = &xd->neighbors_ref_counts[0];

  // Count of forward references (L, L2, L3, or G)
  const int frf_count = ref_counts[LAST_FRAME] + ref_counts[LAST2_FRAME] +
                        ref_counts[LAST3_FRAME] + ref_counts[GOLDEN_FRAME];
  // Count of backward references (B or A)
  const int brf_count = ref_counts[BWDREF_FRAME] + ref_counts[ALTREF2_FRAME] +
                        ref_counts[ALTREF_FRAME];

  const int pred_context =
      (frf_count == brf_count) ? 1 : ((frf_count < brf_count) ? 0 : 2);

  assert(pred_context >= 0 && pred_context < UNI_COMP_REF_CONTEXTS);
  return pred_context;
}